

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O1

void __thiscall
solitaire::piles::StockPileWithCardsTest_initializePileWithCards_Test::TestBody
          (StockPileWithCardsTest_initializePileWithCards_Test *this)

{
  void *pvVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  pointer local_58;
  undefined1 local_50 [16];
  pointer local_40;
  AssertHelper local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_28;
  
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68,
             &(this->super_StockPileWithCardsTest).pileCards);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_28,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68);
  pvVar1 = (void *)CONCAT71(local_68._1_7_,local_68[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_58 - (long)pvVar1);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68,
             &local_28);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_50,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_68);
  pvVar1 = (void *)CONCAT71(local_68._1_7_,local_68[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_58 - (long)pvVar1);
  }
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&local_38,local_50,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  if ((AssertHelperData *)local_50._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_50._0_8_,(long)local_40 - local_50._0_8_);
  }
  if (local_28.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_38.data_ == '\0') {
    testing::Message::Message((Message *)local_68);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    if ((long *)CONCAT71(local_68._1_7_,local_68[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_68._1_7_,local_68[0]) + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  iVar2 = (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
              super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_StockPile).super_Archiver._vptr_Archiver[7])();
  local_50[4] = SUB41(extraout_var,0);
  local_50._0_8_ = (AssertHelperData *)CONCAT44(extraout_var,iVar2);
  if (local_50[4] == false) {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::CmpHelperEQFailure<std::optional<unsigned_int>,std::nullopt_t>
              ((internal *)local_68,"pile->getSelectedCardIndex()","std::nullopt",
               (optional<unsigned_int> *)local_50,(nullopt_t *)&std::nullopt);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((AssertHelperData *)local_50._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)((long)*(Card *)local_50._0_8_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, initializePileWithCards) {
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), std::nullopt);
}